

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
::emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>const&>
          (QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
           *this,pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *key,
          pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> *args)

{
  AnchorVertex *pAVar1;
  long in_FS_OFFSET;
  piter pVar2;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar1 = *(AnchorVertex **)this;
  if (pAVar1 == (AnchorVertex *)0x0) {
    local_30.first = (AnchorVertex *)0x0;
  }
  else {
    if (*(uint *)&pAVar1->_vptr_AnchorVertex < 2) {
      if (pAVar1->m_item < (QGraphicsLayoutItem *)(*(ulong *)&pAVar1->m_edge >> 1)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>const&>
                                   (this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        local_30.second = args->second;
        local_30.first = args->first;
        pVar2 = (piter)emplace_helper<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
                                 (this,key,&local_30);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_0056a163;
    }
    local_30.first = pAVar1;
    if (*(int *)&pAVar1->_vptr_AnchorVertex != -1) {
      LOCK();
      *(int *)&pAVar1->_vptr_AnchorVertex = *(int *)&pAVar1->_vptr_AnchorVertex + 1;
      UNLOCK();
    }
  }
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  ::detach((QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
            *)this);
  pVar2 = (piter)emplace_helper<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>const&>
                           (this,key,args);
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  ::~QHash((QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
            *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_0056a163:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }